

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall
testing::internal::NoExecDeathTest::NoExecDeathTest
          (NoExecDeathTest *this,char *a_statement,
          Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *matcher)

{
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_38;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *local_20;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *matcher_local;
  char *a_statement_local;
  NoExecDeathTest *this_local;
  
  local_20 = matcher;
  matcher_local =
       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *)a_statement;
  a_statement_local = (char *)this;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher(&local_38,matcher);
  ForkingDeathTest::ForkingDeathTest(&this->super_ForkingDeathTest,a_statement,&local_38);
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_38);
  (this->super_ForkingDeathTest).super_DeathTestImpl.super_DeathTest._vptr_DeathTest =
       (_func_int **)&PTR__NoExecDeathTest_001881b8;
  return;
}

Assistant:

NoExecDeathTest(const char* a_statement, Matcher<const std::string&> matcher)
      : ForkingDeathTest(a_statement, std::move(matcher)) {}